

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Svd.h
# Opt level: O0

double __thiscall
singular::Svd<60,_50>::BidiagonalMatrix::applyFirstRotatorFromRight
          (BidiagonalMatrix *this,Rotator *r)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double r22;
  double r21;
  double r12;
  double r11;
  double b2;
  double g1;
  double b1;
  Rotator *r_local;
  BidiagonalMatrix *this_local;
  
  dVar1 = *this->pBlock;
  dVar2 = this->pBlock[1];
  dVar3 = this->pBlock[2];
  dVar4 = Rotator::operator()(r,0,0);
  dVar5 = Rotator::operator()(r,0,1);
  dVar6 = Rotator::operator()(r,1,0);
  dVar7 = Rotator::operator()(r,1,1);
  *this->pBlock = dVar1 * dVar4 + dVar2 * dVar6;
  this->pBlock[1] = dVar1 * dVar5 + dVar2 * dVar7;
  this->pBlock[2] = dVar3 * dVar7;
  return dVar3 * dVar6;
}

Assistant:

double applyFirstRotatorFromRight(const Rotator& r) {
				double b1 = this->pBlock[0];
				double g1 = this->pBlock[1];
				double b2 = this->pBlock[2];
				double r11 = r(0, 0);
				double r12 = r(0, 1);
				double r21 = r(1, 0);
				double r22 = r(1, 1);
				this->pBlock[0] = b1 * r11 + g1 * r21;
				this->pBlock[1] = b1 * r12 + g1 * r22;
				this->pBlock[2] = b2 * r22;
				return b2 * r21;
			}